

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ev.c
# Opt level: O1

void periodic_recalc(ev_loop *loop,ev_periodic *w)

{
  double dVar1;
  double dVar2;
  bool bVar3;
  bool bVar4;
  double dVar5;
  ev_tstamp eVar6;
  double dVar7;
  double dVar8;
  
  dVar7 = w->offset;
  dVar1 = w->interval;
  dVar8 = dVar1;
  if (dVar1 <= 0.0001220703125) {
    dVar8 = 0.0001220703125;
  }
  dVar2 = loop->ev_rt_now;
  dVar5 = floor((dVar2 - dVar7) / dVar8);
  eVar6 = dVar5 * dVar8 + dVar7;
  do {
    if (dVar2 < eVar6) break;
    dVar7 = dVar1 + eVar6;
    bVar3 = NAN(eVar6);
    bVar4 = dVar7 != eVar6;
    eVar6 = (ev_tstamp)
            (-(ulong)(eVar6 == dVar7) & (ulong)dVar2 | ~-(ulong)(eVar6 == dVar7) & (ulong)dVar7);
  } while ((bVar4) || (NAN(dVar7) || bVar3));
  w->at = eVar6;
  return;
}

Assistant:

static void noinline
periodic_recalc (EV_P_ ev_periodic *w)
{
  ev_tstamp interval = w->interval > MIN_INTERVAL ? w->interval : MIN_INTERVAL;
  ev_tstamp at = w->offset + interval * ev_floor ((ev_rt_now - w->offset) / interval);

  /* the above almost always errs on the low side */
  while (at <= ev_rt_now)
    {
      ev_tstamp nat = at + w->interval;

      /* when resolution fails us, we use ev_rt_now */
      if (expect_false (nat == at))
        {
          at = ev_rt_now;
          break;
        }

      at = nat;
    }

  ev_at (w) = at;
}